

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_TagBox.cpp
# Opt level: O0

Vector<int,_std::allocator<int>_> * __thiscall amrex::TagBox::tags(TagBox *this)

{
  BaseFab<char> *this_00;
  long lVar1;
  Long LVar2;
  size_type in_RSI;
  Box *in_RDI;
  int i;
  int *iptr;
  TagType *cptr;
  Vector<int,_std::allocator<int>_> *ar;
  allocator_type *in_stack_ffffffffffffff98;
  Box *this_01;
  int n;
  int local_34;
  int *local_30;
  char *local_28;
  
  this_01 = in_RDI;
  this_00 = (BaseFab<char> *)Box::numPts(in_RDI);
  std::allocator<int>::allocator((allocator<int> *)0x10c0b4f);
  Vector<int,_std::allocator<int>_>::vector
            ((Vector<int,_std::allocator<int>_> *)this_01,in_RSI,(value_type *)in_RDI,
             in_stack_ffffffffffffff98);
  n = (int)((ulong)this_01 >> 0x20);
  std::allocator<int>::~allocator((allocator<int> *)0x10c0b74);
  local_28 = BaseFab<char>::dataPtr(this_00,n);
  local_30 = Vector<int,_std::allocator<int>_>::dataPtr
                       ((Vector<int,_std::allocator<int>_> *)0x10c0b8f);
  local_34 = 0;
  while( true ) {
    lVar1 = (long)local_34;
    LVar2 = Vector<int,_std::allocator<int>_>::size((Vector<int,_std::allocator<int>_> *)0x10c0baf);
    if (LVar2 <= lVar1) break;
    if (*local_28 != '\0') {
      *local_30 = (int)*local_28;
    }
    local_34 = local_34 + 1;
    local_28 = local_28 + 1;
    local_30 = local_30 + 1;
  }
  return (Vector<int,_std::allocator<int>_> *)in_RDI;
}

Assistant:

Vector<int>
TagBox::tags () const noexcept
{
    Vector<int> ar(domain.numPts(), TagBox::CLEAR);

    const TagType* cptr = dataPtr();
    int*           iptr = ar.dataPtr();

    for (int i = 0; i < ar.size(); i++, cptr++, iptr++)
    {
        if (*cptr)
            *iptr = *cptr;
    }

    return ar;
}